

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff_imod_chunk.cpp
# Opt level: O3

ostream * sf2cute::SFRIFFImodChunk::WriteItem
                    (ostream *out,SFModulator source_op,SFGenerator destination_op,int16_t amount,
                    SFModulator amount_source_op,SFTransform transform_op)

{
  undefined3 in_register_00000089;
  
  InsertInt16L<std::ostream>
            (out,(ushort)((uint5)source_op >> 0x16) & 0xfc00 |
                 (ushort)(source_op._0_4_ >> 0xf) & 0x200 |
                 source_op._1_2_ & 0x100 |
                 (ushort)(source_op._0_4_ >> 1) & 0x80 | source_op._0_2_ & 0x7f);
  InsertInt16L<std::ostream>(out,destination_op);
  InsertInt16L<std::ostream>(out,amount);
  InsertInt16L<std::ostream>
            (out,(ushort)((uint5)amount_source_op >> 0x16) & 0xfc00 |
                 (ushort)(amount_source_op._0_4_ >> 0xf) & 0x200 |
                 amount_source_op._1_2_ & 0x100 |
                 (ushort)(amount_source_op._0_4_ >> 1) & 0x80 | amount_source_op._0_2_ & 0x7f);
  InsertInt16L<std::ostream>(out,(uint16_t)CONCAT31(in_register_00000089,transform_op));
  return out;
}

Assistant:

std::ostream & SFRIFFImodChunk::WriteItem(std::ostream & out,
    SFModulator source_op,
    SFGenerator destination_op,
    int16_t amount,
    SFModulator amount_source_op,
    SFTransform transform_op) {
  // struct sfInstModList:
  // SFModulator sfModSrcOper;
  InsertInt16L(out, uint16_t(source_op));

  // SFGenerator sfModDestOper;
  InsertInt16L(out, uint16_t(destination_op));

  // int16_t modAmount;
  InsertInt16L(out, amount);

  // SFModulator sfModAmtSrcOper;
  InsertInt16L(out, uint16_t(amount_source_op));

  // SFTransform sfModTransOper;
  InsertInt16L(out, uint16_t(transform_op));

  return out;
}